

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::ModuleLevelName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,PyiGenerator *this,EnumDescriptor *descriptor)

{
  string *psVar1;
  bool bVar2;
  pointer pcVar3;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string_view separator;
  string_view filename_00;
  string module_alias;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  string module_name;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8 [2];
  string local_78;
  string_view filename;
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_40;
  
  aStack_40 = local_48;
  separator._M_str = ".";
  separator._M_len = 1;
  NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
            (__return_storage_ptr__,descriptor,separator);
  if (descriptor->file_ != this->file_) {
    module_alias._M_dataplus._M_p = (pointer)&module_alias.field_2;
    module_alias._M_string_length = 0;
    module_alias.field_2._M_local_buf[0] = '\0';
    psVar1 = descriptor->file_->name_;
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    filename._M_len = psVar1->_M_string_length;
    this_00 = &this->import_map_;
    filename._M_str = pcVar3;
    local_a8[0].text_ =
         (basic_string_view<char,_std::char_traits<char>_>)
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::find<std::basic_string_view<char,std::char_traits<char>>>
                   ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)this_00,&filename);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_00);
    local_48.slot_ = (slot_type *)0x0;
    bVar2 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)local_a8,(iterator *)&local_48);
    if (bVar2) {
      psVar1 = descriptor->file_->name_;
      filename_00._M_str = pcVar3;
      filename_00._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
      ModuleName_abi_cxx11_(&module_name,(python *)psVar1->_M_string_length,filename_00);
      local_a8[0].delimiter_.c_ = '.';
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
                (&tokens,local_a8);
      local_a8[0].text_ = absl::lts_20250127::NullSafeStringView("_");
      local_48 = (anon_union_8_1_a8a14541_for_iterator_2)
                 tokens.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_len;
      aStack_40 = (anon_union_8_1_a8a14541_for_iterator_2)
                  tokens.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_str;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_78,(lts_20250127 *)local_a8,(AlphaNum *)&local_48,
                 (AlphaNum *)module_name._M_string_length);
      std::__cxx11::string::operator=((string *)&module_alias,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&tokens.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      std::__cxx11::string::~string((string *)&module_name);
    }
    else {
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      at<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,&filename);
      std::__cxx11::string::_M_assign((string *)&module_alias);
    }
    local_a8[0].text_._M_str = module_alias._M_dataplus._M_p;
    local_a8[0].text_._M_len = module_alias._M_string_length;
    _local_48 = absl::lts_20250127::NullSafeStringView(".");
    module_name._M_string_length = (size_type)(__return_storage_ptr__->_M_dataplus)._M_p;
    module_name._M_dataplus._M_p = (pointer)__return_storage_ptr__->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_78,(lts_20250127 *)local_a8,(AlphaNum *)&local_48,(AlphaNum *)&module_name,
               (AlphaNum *)&local_48);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&module_alias);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::ModuleLevelName(const DescriptorT& descriptor) const {
  std::string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    std::string module_alias;
    const absl::string_view filename = descriptor.file()->name();
    if (import_map_.find(filename) == import_map_.end()) {
      std::string module_name = ModuleName(descriptor.file()->name());
      std::vector<absl::string_view> tokens = absl::StrSplit(module_name, '.');
      module_alias = absl::StrCat("_", tokens.back());
    } else {
      module_alias = import_map_.at(filename);
    }
    name = absl::StrCat(module_alias, ".", name);
  }
  return name;
}